

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O1

void __thiscall
LargeGapGrayCode::computeMinGap
          (LargeGapGrayCode *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths,
          int *minGap,int *minCount)

{
  _Rb_tree_node_base *p_Var1;
  
  *minGap = 999;
  for (p_Var1 = (runLengths->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(runLengths->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if ((int)p_Var1[1]._M_color < *minGap) {
      *minGap = p_Var1[1]._M_color;
      *minCount = *(int *)&p_Var1[1].field_0x4;
    }
  }
  return;
}

Assistant:

void LargeGapGrayCode::computeMinGap(const std::map<int, int>& runLengths, int& minGap, int& minCount)
{
	minGap = 999;

	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		if(it->first < minGap) {
			minGap = it->first;
			minCount = it->second;
		}
	}
}